

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O0

FT_UInt bdf_cmap_char_index(FT_CMap bdfcmap,FT_UInt32 charcode)

{
  long lVar1;
  ulong uVar2;
  FT_Face pFVar3;
  FT_ULong code;
  FT_UShort result;
  FT_ULong mid;
  FT_ULong max;
  FT_ULong min;
  BDF_encoding_el *encodings;
  BDF_CMap cmap;
  FT_UInt32 charcode_local;
  FT_CMap bdfcmap_local;
  
  lVar1 = *(long *)&bdfcmap[1].charmap.encoding;
  code._6_2_ = 0;
  max = 0;
  pFVar3 = bdfcmap[1].charmap.face;
  do {
    mid = (FT_ULong)pFVar3;
    if (mid <= max) {
LAB_002ea5fe:
      return (FT_UInt)code._6_2_;
    }
    pFVar3 = (FT_Face)(max + mid >> 1);
    uVar2 = *(ulong *)(lVar1 + (long)pFVar3 * 0x10);
    if (charcode == uVar2) {
      code._6_2_ = *(short *)(lVar1 + (long)pFVar3 * 0x10 + 8) + 1;
      goto LAB_002ea5fe;
    }
    if (uVar2 <= charcode) {
      max = (long)pFVar3 + 1;
      pFVar3 = (FT_Face)mid;
    }
  } while( true );
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  bdf_cmap_char_index( FT_CMap    bdfcmap,
                       FT_UInt32  charcode )
  {
    BDF_CMap          cmap      = (BDF_CMap)bdfcmap;
    BDF_encoding_el*  encodings = cmap->encodings;
    FT_ULong          min, max, mid; /* num_encodings */
    FT_UShort         result    = 0; /* encodings->glyph */


    min = 0;
    max = cmap->num_encodings;

    while ( min < max )
    {
      FT_ULong  code;


      mid  = ( min + max ) >> 1;
      code = (FT_ULong)encodings[mid].enc;

      if ( charcode == code )
      {
        /* increase glyph index by 1 --              */
        /* we reserve slot 0 for the undefined glyph */
        result = encodings[mid].glyph + 1;
        break;
      }

      if ( charcode < code )
        max = mid;
      else
        min = mid + 1;
    }

    return result;
  }